

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualSol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_vector)

{
  bool bVar1;
  Status SVar2;
  Representation RVar3;
  int iVar4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int i_1;
  Desc *ds;
  int i;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff08;
  Status in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff20;
  undefined4 local_b8;
  int local_b4;
  Desc *local_b0;
  DataKey local_a4;
  SPxRowId local_9c;
  DataKey local_94;
  int local_8c;
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_50;
  Status local_3c;
  undefined4 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined4 *local_8;
  
  local_50 = in_RSI;
  bVar1 = isInitialized(in_RDI);
  if (bVar1) {
    RVar3 = rep(in_RDI);
    if (RVar3 == ROW) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::maxRowObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x2e09ba);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_ffffffffffffff08);
      local_8c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x2e09d4);
      while (local_8c = local_8c + -1, -1 < local_8c) {
        local_94 = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::baseId(in_stack_ffffffffffffff08,0);
        bVar1 = SPxId::isSPxRowId((SPxId *)&local_94);
        if (bVar1) {
          fVec(in_RDI);
          in_stack_ffffffffffffff20 =
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          in_stack_ffffffffffffff18 = local_50;
          local_a4 = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::baseId(in_stack_ffffffffffffff08,0);
          SPxRowId::SPxRowId(&local_9c,(SPxId *)&local_a4);
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (SPxRowId *)in_stack_ffffffffffffff08);
          local_10 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                  (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          local_18 = in_stack_ffffffffffffff20;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff08);
        }
      }
    }
    else {
      local_b0 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::desc(&in_RDI->
                         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
      local_b4 = 0;
      while (iVar6 = local_b4,
            iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x2e0af3), iVar6 < iVar4) {
        in_stack_ffffffffffffff10 =
             SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::rowStatus((Desc *)CONCAT44(iVar6,in_stack_ffffffffffffff10),
                               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        iVar4 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        if (((((uint)(in_stack_ffffffffffffff10 + P_FREE) < 2) ||
             (in_stack_ffffffffffffff10 == D_ON_LOWER)) || (in_stack_ffffffffffffff10 == D_ON_BOTH))
           || (in_stack_ffffffffffffff10 == D_UNDEFINED)) {
          local_b8 = 0;
          local_30 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(iVar6,in_stack_ffffffffffffff10),iVar4);
          local_38 = &local_b8;
          local_8 = local_38;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar6,in_stack_ffffffffffffff10),
                     (long_long_type)in_stack_ffffffffffffff08);
        }
        else {
          in_stack_ffffffffffffff08 =
               (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(iVar6,in_stack_ffffffffffffff10),iVar4);
          local_20 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(iVar6,in_stack_ffffffffffffff10),
                                  (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          local_28 = in_stack_ffffffffffffff08;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar6,in_stack_ffffffffffffff10),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff08);
        }
        local_b4 = local_b4 + 1;
      }
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::spxSense(&in_RDI->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
    local_3c = status(in_stack_ffffffffffffff18);
  }
  else {
    SVar2 = status(in_stack_ffffffffffffff18);
    if (SVar2 != NO_PROBLEM) {
      local_85 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"XSOLVE08 No Problem loaded",&local_71);
      SPxStatusException::SPxStatusException
                ((SPxStatusException *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                 ,(string *)in_stack_ffffffffffffff08);
      local_85 = 0;
      __cxa_throw(uVar5,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
    }
    local_3c = status(in_stack_ffffffffffffff18);
  }
  return local_3c;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE08 No Problem loaded");
   }

   if(rep() == ROW)
   {
      int i;
      p_vector = this->maxRowObj();

      for(i = this->nCols() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = fVec()[i];
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nRows(); ++i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = (*theCoPvec)[i];
         }
      }
   }

   p_vector *= Real(this->spxSense());

   return status();
}